

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_nested_loop_join.cpp
# Opt level: O2

void __thiscall
duckdb::PhysicalNestedLoopJoinState::~PhysicalNestedLoopJoinState(PhysicalNestedLoopJoinState *this)

{
  ~PhysicalNestedLoopJoinState(this);
  operator_delete(this);
  return;
}

Assistant:

PhysicalNestedLoopJoinState(ClientContext &context, const PhysicalNestedLoopJoin &op,
	                            const vector<JoinCondition> &conditions)
	    : fetch_next_left(true), fetch_next_right(false), lhs_executor(context), left_tuple(0), right_tuple(0),
	      left_outer(IsLeftOuterJoin(op.join_type)) {
		vector<LogicalType> condition_types;
		for (auto &cond : conditions) {
			lhs_executor.AddExpression(*cond.left);
			condition_types.push_back(cond.left->return_type);
		}
		auto &allocator = Allocator::Get(context);
		left_condition.Initialize(allocator, condition_types);
		right_condition.Initialize(allocator, condition_types);
		right_payload.Initialize(allocator, op.children[1].get().GetTypes());
		left_outer.Initialize(STANDARD_VECTOR_SIZE);
	}